

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

void __thiscall
icu_63::Locale::setUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  char *keywordName_00;
  char *keywordValue_00;
  CharString keywordValue_nul;
  CharString keywordName_nul;
  CharString local_b0;
  CharString local_70;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
  local_70.len = 0;
  *local_70.buffer.ptr = '\0';
  CharString::append(&local_70,keywordName.ptr_,keywordName.length_,status);
  MaybeStackArray<char,_40>::MaybeStackArray(&local_b0.buffer);
  local_b0.len = 0;
  *local_b0.buffer.ptr = '\0';
  CharString::append(&local_b0,keywordValue.ptr_,keywordValue.length_,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    keywordName_00 = uloc_toLegacyKey_63(local_70.buffer.ptr);
    if (keywordName_00 != (char *)0x0) {
      keywordValue_00 = uloc_toLegacyType_63(local_70.buffer.ptr,local_b0.buffer.ptr);
      if (keywordValue_00 != (char *)0x0) {
        setKeywordValue(this,keywordName_00,keywordValue_00,status);
        goto LAB_003104fc;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
LAB_003104fc:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_b0.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  return;
}

Assistant:

void
Locale::setUnicodeKeywordValue(StringPiece keywordName,
                               StringPiece keywordValue,
                               UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);

    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    const char* legacy_value =
        uloc_toLegacyType(keywordName_nul.data(), keywordValue_nul.data());

    if (legacy_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    setKeywordValue(legacy_key, legacy_value, status);
}